

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QToolBarAreaLayoutItem * __thiscall
QToolBarAreaLayout::item(QToolBarAreaLayout *this,QList<int> *path)

{
  uint *puVar1;
  pointer pQVar2;
  pointer pQVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = (uint *)(path->d).ptr;
  uVar4 = (ulong)*puVar1;
  if (((uVar4 < 4) && (uVar5 = (ulong)(int)puVar1[1], -1 < (long)uVar5)) &&
     (uVar5 < (ulong)this->docks[uVar4].lines.d.size)) {
    pQVar2 = QList<QToolBarAreaLayoutLine>::data(&this->docks[uVar4].lines);
    uVar4 = (ulong)(path->d).ptr[2];
    if ((-1 < (long)uVar4) && (uVar4 < (ulong)pQVar2[uVar5].toolBarItems.d.size)) {
      pQVar3 = QList<QToolBarAreaLayoutItem>::data(&pQVar2[uVar5].toolBarItems);
      return pQVar3 + uVar4;
    }
  }
  return (QToolBarAreaLayoutItem *)0x0;
}

Assistant:

const T *data() const noexcept { return ptr; }